

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall
google::protobuf::UnknownFieldSet::AddVarint(UnknownFieldSet *this,int number,uint64 value)

{
  iterator __position;
  vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *this_00;
  UnknownField field;
  UnknownField local_18;
  
  local_18.type_ = 0;
  this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *
            )this->fields_;
  local_18.number_ = number;
  local_18.data_.varint_ = value;
  if (this_00 ==
      (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *)0x0)
  {
    this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
               *)operator_new(0x18);
    *(undefined8 *)&this_00->field_0x0 = 0;
    *(undefined8 *)(this_00 + 8) = 0;
    *(undefined8 *)(this_00 + 0x10) = 0;
    this->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         this_00;
  }
  __position._M_current = *(UnknownField **)(this_00 + 8);
  if (__position._M_current == *(UnknownField **)(this_00 + 0x10)) {
    std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
    _M_realloc_insert<google::protobuf::UnknownField_const&>(this_00,__position,&local_18);
  }
  else {
    (__position._M_current)->number_ = local_18.number_;
    (__position._M_current)->type_ = local_18.type_;
    ((__position._M_current)->data_).varint_ = (uint64)local_18.data_;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
  }
  return;
}

Assistant:

void UnknownFieldSet::AddVarint(int number, uint64 value) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_VARINT);
  field.data_.varint_ = value;
  if (fields_ == NULL) fields_ = new std::vector<UnknownField>();
  fields_->push_back(field);
}